

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdInitializeConfidentialTx(void *handle,uint32_t version,uint32_t locktime,char **tx_string)

{
  char *pcVar1;
  CfdException *this;
  ConfidentialTransactionController ctxc;
  string local_a0;
  ConfidentialTransactionController local_80;
  
  cfd::Initialize();
  if (tx_string != (char **)0x0) {
    cfd::ConfidentialTransactionController::ConfidentialTransactionController
              (&local_80,version,locktime);
    cfd::AbstractTransactionController::GetHex_abi_cxx11_
              (&local_a0,&local_80.super_AbstractTransactionController);
    pcVar1 = cfd::capi::CreateString(&local_a0);
    *tx_string = pcVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    local_80.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)&PTR__ConfidentialTransactionController_00735388;
    cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_80.transaction_);
    return 0;
  }
  local_80.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)0x5f3c92;
  local_80.super_AbstractTransactionController.tx_address_._0_4_ = 0xb1;
  local_80.transaction_.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x5f3cb3
  ;
  cfd::core::logger::log<>((CfdSourceLocation *)&local_80,kCfdLogLevelWarning,"tx output is null.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_80.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&local_80.transaction_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"Failed to parameter. tx output is null.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&local_80);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeConfidentialTx(
    void* handle, uint32_t version, uint32_t locktime, char** tx_string) {
  try {
    cfd::Initialize();
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    ConfidentialTransactionController ctxc(version, locktime);
    *tx_string = CreateString(ctxc.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}